

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<ProKey,_ProString> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProString>_>::findNode<ProKey>
          (Data<QHashPrivate::Node<ProKey,_ProString>_> *this,ProKey *key)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  Node<ProKey,_ProString> *pNVar4;
  Bucket BVar5;
  
  uVar2 = this->seed;
  sVar3 = qHash(&key->super_ProString);
  BVar5 = findBucketWithHash<ProKey>(this,key,uVar2 ^ sVar3);
  bVar1 = (BVar5.span)->offsets[BVar5.index];
  if (bVar1 == 0xff) {
    pNVar4 = (Node<ProKey,_ProString> *)0x0;
  }
  else {
    pNVar4 = (Node<ProKey,_ProString> *)(((BVar5.span)->entries->storage).data + (uint)bVar1 * 0x60)
    ;
  }
  return pNVar4;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }